

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderV2fAttribute(ImfHeader *hdr,char *name,float *x,float *y)

{
  TypedAttribute<Imath_3_2::Vec2<float>_> *this;
  Vec2<float> *pVVar1;
  float *in_RCX;
  float *in_RDX;
  ImfHeader *in_RDI;
  exception *e;
  V2f *v;
  char *in_stack_ffffffffffffffc8;
  Header *in_stack_ffffffffffffffd0;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  this = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>>>
                   (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pVVar1 = Imf_3_4::TypedAttribute<Imath_3_2::Vec2<float>_>::value(this);
  *in_RDX = pVVar1->x;
  *in_RCX = pVVar1->y;
  return 1;
}

Assistant:

int
ImfHeaderV2fAttribute (
    const ImfHeader* hdr, const char name[], float* x, float* y)
{
    try
    {
        const V2f& v =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V2fAttribute> (
                    name)
                .value ();

        *x = v.x;
        *y = v.y;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}